

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_point.cpp
# Opt level: O2

bool __thiscall ON_3fVector::Unitize(ON_3fVector *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  dVar3 = Length(this);
  if (0.0 < dVar3) {
    uVar1 = this->x;
    uVar2 = this->y;
    auVar4._0_8_ = (double)(float)uVar1;
    auVar4._8_8_ = (double)(float)uVar2;
    auVar5._8_8_ = dVar3;
    auVar5._0_8_ = dVar3;
    auVar5 = divpd(auVar4,auVar5);
    this->x = (float)auVar5._0_8_;
    this->y = (float)auVar5._8_8_;
    this->z = (float)((double)this->z / dVar3);
  }
  return 0.0 < dVar3;
}

Assistant:

bool ON_3fVector::Unitize()
{
  bool rc = false;
  // Since x,y,z are floats, d will not be denormalized and the
  // ON_DBL_MIN tests in ON_2dVector::Unitize() are not needed.
  double d = Length();
  if ( d > 0.0 ) 
  {
    double dx = x;
    double dy = y;
    double dz = z;
    x = (float)(dx/d);
    y = (float)(dy/d);
    z = (float)(dz/d);
    rc = true;
  }
  return rc;
}